

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O3

int32 rw::d3d8::getSizeNativeData(void *object,int32 param_2,int32 param_3)

{
  ushort uVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  Geometry *geometry;
  
  piVar2 = *(int **)((long)object + 0x98);
  iVar4 = 0;
  if ((piVar2 != (int *)0x0) && (iVar4 = 0, *piVar2 == 8)) {
    uVar1 = *(ushort *)((long)piVar2 + 6);
    iVar4 = (uint)uVar1 * 0x2c + 0x18;
    if (uVar1 != 0) {
      lVar3 = *(long *)(piVar2 + 2);
      lVar5 = 0;
      do {
        iVar4 = iVar4 + *(int *)(lVar3 + 0xc + lVar5) * 2 +
                *(int *)(lVar3 + 4 + lVar5) * *(int *)(lVar3 + 8 + lVar5);
        lVar5 = lVar5 + 0x38;
      } while ((uint)uVar1 * 0x38 != (int)lVar5);
    }
  }
  return iVar4;
}

Assistant:

int32
getSizeNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D8)
		return 0;

	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	InstanceData *inst = header->inst;
	int32 size = 12 + 4 + 4 + 4 + header->numMeshes*0x2C;
	for(int32 i = 0; i < header->numMeshes; i++){
		size += inst->numIndices*2 + inst->numVertices*inst->stride;
		inst++;
	}
	return size;
}